

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int moveToRightmost(BtCursor *pCur)

{
  MemPage *pMVar1;
  int rc;
  u32 newPgno;
  int iVar2;
  MemPage *pPage;
  
  do {
    pMVar1 = pCur->pPage;
    if (pMVar1->leaf != '\0') {
      pCur->ix = pMVar1->nCell - 1;
      return 0;
    }
    newPgno = sqlite3Get4byte(pMVar1->aData + (ulong)pMVar1->hdrOffset + 8);
    pCur->ix = pMVar1->nCell;
    iVar2 = moveToChild(pCur,newPgno);
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

static int moveToRightmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage = 0;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( !(pPage = pCur->pPage)->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCur->ix = pPage->nCell;
    rc = moveToChild(pCur, pgno);
    if( rc ) return rc;
  }
  pCur->ix = pPage->nCell-1;
  assert( pCur->info.nSize==0 );
  assert( (pCur->curFlags & BTCF_ValidNKey)==0 );
  return SQLITE_OK;
}